

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.h
# Opt level: O0

void __thiscall position::~position(position *this)

{
  position *this_local;
  
  std::vector<Rootmove,_std::allocator<Rootmove>_>::~vector(&this->root_moves);
  parameters::~parameters(&this->params);
  std::__cxx11::string::~string((string *)&this->bestmove);
  return;
}

Assistant:

~position() { }